

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::child(xml_node *this,char_t *name_)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  
  if (this->_root != (xml_node_struct *)0x0) {
    for (pxVar1 = this->_root->first_child; pxVar1 != (xml_node_struct *)0x0;
        pxVar1 = pxVar1->next_sibling) {
      if ((pxVar1->name != (char_t *)0x0) &&
         (bVar2 = impl::anon_unknown_0::strequal(name_,pxVar1->name), bVar2)) {
        return (xml_node)pxVar1;
      }
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node xml_node::child(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_node(i);
		}

		return xml_node();
	}